

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DTDScanner::DTDScanner
          (DTDScanner *this,DTDGrammar *dtdGrammar,DocTypeHandler *docTypeHandler,
          MemoryManager *grammarPoolMemoryManager,MemoryManager *manager)

{
  NameIdPool<xercesc_4_0::DTDEntityDecl> *this_00;
  
  this->_vptr_DTDScanner = (_func_int **)&PTR__DTDScanner_0041b1f8;
  this->fMemoryManager = manager;
  this->fGrammarPoolMemoryManager = grammarPoolMemoryManager;
  this->fDocTypeHandler = docTypeHandler;
  this->fDumAttDef = (DTDAttDef *)0x0;
  this->fDumElemDecl = (DTDElementDecl *)0x0;
  *(undefined8 *)((long)&this->fDumElemDecl + 1) = 0;
  *(undefined8 *)((long)&this->fDumEntityDecl + 1) = 0;
  this->fNextAttrId = 1;
  this->fDTDGrammar = dtdGrammar;
  this->fDocTypeReaderId = 0;
  this->fBufMgr = (XMLBufferMgr *)0x0;
  this->fReaderMgr = (ReaderMgr *)0x0;
  this->fScanner = (XMLScanner *)0x0;
  this->fPEntityDeclPool = (NameIdPool<xercesc_4_0::DTDEntityDecl> *)0x0;
  this->fEmptyNamespaceId = 0;
  this_00 = (NameIdPool<xercesc_4_0::DTDEntityDecl> *)XMemory::operator_new(0x58,manager);
  NameIdPool<xercesc_4_0::DTDEntityDecl>::NameIdPool(this_00,0x6d,0x80,this->fMemoryManager);
  this->fPEntityDeclPool = this_00;
  return;
}

Assistant:

DTDScanner::DTDScanner( DTDGrammar*           dtdGrammar
                      , DocTypeHandler* const docTypeHandler
                      , MemoryManager* const  grammarPoolMemoryManager
                      , MemoryManager* const  manager) :
    fMemoryManager(manager)
    , fGrammarPoolMemoryManager(grammarPoolMemoryManager)
    , fDocTypeHandler(docTypeHandler)
    , fDumAttDef(0)
    , fDumElemDecl(0)
    , fDumEntityDecl(0)
    , fInternalSubset(false)
    , fNextAttrId(1)
    , fDTDGrammar(dtdGrammar)
    , fBufMgr(0)
    , fReaderMgr(0)
    , fScanner(0)
    , fPEntityDeclPool(0)
    , fEmptyNamespaceId(0)
    , fDocTypeReaderId(0)
{
    fPEntityDeclPool = new (fMemoryManager) NameIdPool<DTDEntityDecl>(109, 128, fMemoryManager);
}